

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O1

void printName(PSNode *node,bool dot)

{
  undefined8 *puVar1;
  int iVar2;
  raw_ostream *prVar3;
  ulong uVar4;
  char cVar5;
  raw_ostream *prVar6;
  byte bVar7;
  long lVar8;
  char *pcVar9;
  bool bVar10;
  string nm;
  ostringstream ostr;
  code *local_220;
  undefined4 local_218;
  long local_210;
  undefined8 uStack_208;
  long local_200;
  undefined1 local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8;
  Pointer *local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  long *local_1b8 [2];
  long local_1a8 [2];
  Pointer local_198 [7];
  ios_base local_128 [264];
  
  local_1d0 = 0;
  local_1c8 = '\0';
  iVar2 = *(int *)(node + 0x90);
  if (iVar2 == 0x15) {
    pcVar9 = "null";
LAB_0011308f:
    bVar10 = false;
  }
  else {
    if (iVar2 == 0x16) {
      pcVar9 = "unknown";
      goto LAB_0011308f;
    }
    if (iVar2 == 0x17) {
      pcVar9 = (char *)0x0;
      bVar10 = *(long *)(node + 0x18) != 0;
      if (!bVar10) {
        pcVar9 = "invalidated";
      }
    }
    else {
      bVar10 = true;
      pcVar9 = (char *)0x0;
    }
  }
  local_1d8 = &local_1c8;
  if (bVar10) {
    if (ids_only[0x80] != '\x01') {
      prVar3 = *(raw_ostream **)(node + 0x18);
      if (prVar3 == (raw_ostream *)0x0) {
        if (dot) {
          printf("<%u> (no name)\\n",(ulong)*(uint *)(node + 8));
          iVar2 = *(int *)(node + 0x90);
          if (iVar2 == 10) {
            if (*(PSNode **)(node + 0x98) != (PSNode *)0x0) {
              printName(*(PSNode **)(node + 0x98),true);
            }
          }
          else if (iVar2 == 0x12) {
            if ((*(long *)(node + 200) == 0) ||
               (uVar4 = *(ulong *)(*(long *)(node + 0xc0) + 0x10), (uVar4 & 1) != 0)) {
              lVar8 = 0;
            }
            else {
              lVar8 = 0;
              do {
                if (lVar8 == 0x3f) {
                  lVar8 = 0x40;
                  break;
                }
                bVar7 = (byte)lVar8;
                lVar8 = lVar8 + 1;
              } while ((uVar4 >> (bVar7 & 0x3f) & 2) == 0);
            }
            puVar1 = (undefined8 *)
                     (*(long *)(*(long *)(node + 0xc0) + 8) * 0x10 + -0x10 +
                     lVar8 * 0x10 + __M_assign);
            local_198[0].target = (PSNode *)*puVar1;
            local_198[0].offset.offset = puVar1[1];
            dumpPointer(local_198,true);
          }
          else if (node != (PSNode *)0x0 && iVar2 == 0xb) {
            printf("%s\\n",*(undefined8 *)(node + 0xe8));
          }
        }
        else {
          printf("<%u> ",(ulong)*(uint *)(node + 8));
          printPSNodeType(*(PSNodeType *)(node + 0x90));
        }
        goto LAB_00113312;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      local_218 = 0;
      local_1f8 = 0;
      local_1f0 = 0;
      local_1e8 = 1;
      local_210 = 0;
      uStack_208 = 0;
      local_200 = 0;
      local_220 = std::__cxx11::stringbuf::str;
      local_1e0 = local_198;
      if ((names_with_funs[0x80] == '\x01') && (0x1a < (byte)prVar3[0x10])) {
        pcVar9 = (char *)llvm::Value::getName();
        prVar6 = llvm::raw_ostream::operator<<((raw_ostream *)&local_220,pcVar9);
        if (*(undefined1 **)(prVar6 + 0x18) == *(undefined1 **)(prVar6 + 0x20)) {
          llvm::raw_ostream::write((char *)prVar6,0x11ca65);
        }
        else {
          **(undefined1 **)(prVar6 + 0x20) = 0x3a;
          *(long *)(prVar6 + 0x20) = *(long *)(prVar6 + 0x20) + 1;
        }
      }
      if (prVar3[0x10] == (raw_ostream)0x0) {
        pcVar9 = (char *)llvm::Value::getName();
        llvm::raw_ostream::operator<<((raw_ostream *)&local_220,pcVar9);
      }
      else {
        llvm::Value::print(prVar3,SUB81(&local_220,0));
      }
      if (local_200 != local_210) {
        llvm::raw_ostream::flush_nonempty();
      }
      std::__cxx11::stringbuf::str();
      llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&local_220);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
      std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_1b8);
      pcVar9 = local_1d8;
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
        pcVar9 = local_1d8;
      }
      goto LAB_001132f8;
    }
  }
  else {
LAB_001132f8:
    if (ids_only[0x80] == '\0') {
      cVar5 = *pcVar9;
      if (cVar5 != '\0') {
        lVar8 = 1;
        do {
          if (lVar8 == 0x47) {
            printf(" ...");
            break;
          }
          if (cVar5 == '\"') {
            putchar(0x5c);
          }
          putchar((int)pcVar9[lVar8 + -1]);
          cVar5 = pcVar9[lVar8];
          lVar8 = lVar8 + 1;
        } while (cVar5 != '\0');
      }
      goto LAB_00113312;
    }
  }
  printf(" <%u>",(ulong)*(uint *)(node + 8));
LAB_00113312:
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  return;
}

Assistant:

static void printName(PSNode *node, bool dot = false) {
    std::string nm;
    const char *name = nullptr;
    if (node->isNull()) {
        name = "null";
    } else if (node->isUnknownMemory()) {
        name = "unknown";
    } else if (node->isInvalidated() && !node->getUserData<llvm::Value>()) {
        name = "invalidated";
    }

    if (!name) {
        if (ids_only) {
            printf(" <%u>", node->getID());
            return;
        }

        if (!node->getUserData<llvm::Value>()) {
            if (dot) {
                printf("<%u> (no name)\\n", node->getID());

                if (node->getType() == PSNodeType::CONSTANT) {
                    dumpPointer(*(node->pointsTo.begin()), dot);
                } else if (node->getType() == PSNodeType::CALL_RETURN) {
                    if (PSNode *paired = node->getPairedNode())
                        printName(paired, dot);
                } else if (PSNodeEntry *entry = PSNodeEntry::get(node)) {
                    printf("%s\\n", entry->getFunctionName().c_str());
                }
            } else {
                printf("<%u> ", node->getID());
                printPSNodeType(node->getType());
            }

            return;
        }

        nm = getInstName(node->getUserData<llvm::Value>());
        name = nm.c_str();
    }

    if (ids_only) {
        printf(" <%u>", node->getID());
        return;
    }

    // escape the " character
    for (int i = 0; name[i] != '\0'; ++i) {
        // crop long names
        if (i >= 70) {
            printf(" ...");
            break;
        }

        if (name[i] == '"')
            putchar('\\');

        putchar(name[i]);
    }
}